

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

double __thiscall
duckdb::WindowQuantileState<signed_char>::WindowScalar<double,false>
          (WindowQuantileState<signed_char> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  bool bVar1;
  pointer this_00;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  InternalException *this_01;
  QuantileSortTree *in_RDI;
  IndexError *idx_err;
  array<signed_char,_2UL> dest;
  Interpolator<false> interp;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  vector<std::pair<unsigned_long,_signed_char>,_true> *in_stack_fffffffffffffee0;
  QuantileValue *in_stack_fffffffffffffee8;
  allocator *paVar5;
  Interpolator<false> *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  char in_stack_fffffffffffffeff;
  HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  char cVar6;
  Vector *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff38;
  SubFrames *in_stack_ffffffffffffff40;
  QuantileCursor<signed_char> *in_stack_ffffffffffffff48;
  allocator local_a1;
  string local_a0 [152];
  double local_8;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0xa699f9);
  if (bVar1) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffee0);
    local_8 = QuantileSortTree::WindowScalar<signed_char,double,false>
                        (in_RDI,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                         (QuantileValue *)
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                        *)0xa69a55);
    if (!bVar1) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar5 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"No accelerator for scalar QUANTILE",paVar5);
      duckdb::InternalException::InternalException(this_01,local_a0);
      __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
                            *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
    ::size(this_00);
    Interpolator<false>::Interpolator
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(idx_t)in_stack_fffffffffffffee0,
               (bool)in_stack_fffffffffffffedf);
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
                  *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
    ::at(in_stack_ffffffffffffff00,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
         (size_t)in_stack_fffffffffffffef0,
         (vector<std::pair<unsigned_long,_signed_char>,_std::allocator<std::pair<unsigned_long,_signed_char>_>_>
          *)in_stack_fffffffffffffee8);
    pvVar2 = vector<std::pair<unsigned_long,_signed_char>,_true>::operator[]
                       (in_stack_fffffffffffffee0,
                        CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    cVar6 = pvVar2->second;
    pvVar3 = std::array<signed_char,_2UL>::operator[]
                       ((array<signed_char,_2UL> *)in_stack_fffffffffffffee0,
                        CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    *pvVar3 = cVar6;
    sVar4 = std::
            vector<std::pair<unsigned_long,_signed_char>,_std::allocator<std::pair<unsigned_long,_signed_char>_>_>
            ::size((vector<std::pair<unsigned_long,_signed_char>,_std::allocator<std::pair<unsigned_long,_signed_char>_>_>
                    *)(in_RDI + 5));
    if (sVar4 < 2) {
      pvVar2 = vector<std::pair<unsigned_long,_signed_char>,_true>::operator[]
                         (in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      in_stack_fffffffffffffeff = pvVar2->second;
      pvVar3 = std::array<signed_char,_2UL>::operator[]
                         ((array<signed_char,_2UL> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      *pvVar3 = in_stack_fffffffffffffeff;
    }
    else {
      pvVar2 = vector<std::pair<unsigned_long,_signed_char>,_true>::operator[]
                         (in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      cVar6 = pvVar2->second;
      pvVar3 = std::array<signed_char,_2UL>::operator[]
                         ((array<signed_char,_2UL> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      *pvVar3 = cVar6;
    }
    std::array<signed_char,_2UL>::data((array<signed_char,_2UL> *)0xa69c4e);
    local_8 = Interpolator<false>::Extract<signed_char,double>
                        ((Interpolator<false> *)
                         CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                         &in_stack_fffffffffffffef0->desc,(Vector *)in_stack_fffffffffffffee8);
  }
  return local_8;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}